

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::HardSwish_x86_avx512::forward_inplace
          (HardSwish_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  int iVar4;
  undefined1 auVar5 [32];
  uint uVar6;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  long lVar7;
  undefined1 (*pauVar8) [64];
  int iVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  float fVar23;
  
  iVar4 = bottom_top_blob->c;
  if (0 < (long)iVar4) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar7 = 0;
    auVar15 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar18._8_4_ = 0x3f800000;
    auVar18._0_8_ = 0x3f8000003f800000;
    auVar18._12_4_ = 0x3f800000;
    auVar18._16_4_ = 0x3f800000;
    auVar18._20_4_ = 0x3f800000;
    auVar18._24_4_ = 0x3f800000;
    auVar18._28_4_ = 0x3f800000;
    auVar19._8_4_ = 0x3f800000;
    auVar19._0_8_ = 0x3f8000003f800000;
    auVar19._12_4_ = 0x3f800000;
    do {
      pauVar8 = (undefined1 (*) [64])
                (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar6 < 0x10) {
        uVar10 = 0;
      }
      else {
        iVar9 = 0xf;
        do {
          auVar16 = vbroadcastss_avx512f(ZEXT416((uint)(this->super_HardSwish).alpha));
          fVar1 = (this->super_HardSwish).beta;
          auVar17._4_4_ = fVar1;
          auVar17._0_4_ = fVar1;
          auVar17._8_4_ = fVar1;
          auVar17._12_4_ = fVar1;
          auVar17._16_4_ = fVar1;
          auVar17._20_4_ = fVar1;
          auVar17._24_4_ = fVar1;
          auVar17._28_4_ = fVar1;
          auVar17._32_4_ = fVar1;
          auVar17._36_4_ = fVar1;
          auVar17._40_4_ = fVar1;
          auVar17._44_4_ = fVar1;
          auVar17._48_4_ = fVar1;
          auVar17._52_4_ = fVar1;
          auVar17._56_4_ = fVar1;
          auVar17._60_4_ = fVar1;
          auVar17 = vfmadd213ps_avx512f(auVar16,*pauVar8,auVar17);
          auVar17 = vmaxps_avx512f(auVar17,ZEXT1664(ZEXT816(0) << 0x40));
          auVar17 = vminps_avx512f(auVar17,auVar15);
          auVar17 = vmulps_avx512f(auVar17,*pauVar8);
          *pauVar8 = auVar17;
          pauVar8 = pauVar8 + 1;
          iVar9 = iVar9 + 0x10;
          uVar10 = uVar6 & 0xfffffff0;
        } while (iVar9 < (int)uVar6);
      }
      uVar12 = uVar10 | 7;
      while ((int)uVar12 < (int)uVar6) {
        fVar1 = (this->super_HardSwish).alpha;
        auVar22._4_4_ = fVar1;
        auVar22._0_4_ = fVar1;
        auVar22._8_4_ = fVar1;
        auVar22._12_4_ = fVar1;
        auVar22._16_4_ = fVar1;
        auVar22._20_4_ = fVar1;
        auVar22._24_4_ = fVar1;
        auVar22._28_4_ = fVar1;
        auVar3 = *(undefined1 (*) [32])*pauVar8;
        fVar1 = (this->super_HardSwish).beta;
        auVar14._4_4_ = fVar1;
        auVar14._0_4_ = fVar1;
        auVar14._8_4_ = fVar1;
        auVar14._12_4_ = fVar1;
        auVar14._16_4_ = fVar1;
        auVar14._20_4_ = fVar1;
        auVar14._24_4_ = fVar1;
        auVar14._28_4_ = fVar1;
        auVar14 = vfmadd213ps_avx512vl(auVar22,auVar3,auVar14);
        auVar14 = vmaxps_avx(auVar14,ZEXT1632(ZEXT816(0) << 0x40));
        auVar14 = vminps_avx(auVar14,auVar18);
        auVar5._4_4_ = auVar14._4_4_ * auVar3._4_4_;
        auVar5._0_4_ = auVar14._0_4_ * auVar3._0_4_;
        auVar5._8_4_ = auVar14._8_4_ * auVar3._8_4_;
        auVar5._12_4_ = auVar14._12_4_ * auVar3._12_4_;
        auVar5._16_4_ = auVar14._16_4_ * auVar3._16_4_;
        auVar5._20_4_ = auVar14._20_4_ * auVar3._20_4_;
        auVar5._24_4_ = auVar14._24_4_ * auVar3._24_4_;
        auVar5._28_4_ = auVar14._28_4_;
        *(undefined1 (*) [32])*pauVar8 = auVar5;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x20);
        uVar12 = uVar10 + 0xf;
        uVar10 = uVar10 + 8;
      }
      uVar12 = uVar10 | 3;
      while ((int)uVar12 < (int)uVar6) {
        fVar1 = (this->super_HardSwish).alpha;
        auVar20._4_4_ = fVar1;
        auVar20._0_4_ = fVar1;
        auVar20._8_4_ = fVar1;
        auVar20._12_4_ = fVar1;
        auVar2 = *(undefined1 (*) [16])*pauVar8;
        fVar1 = (this->super_HardSwish).beta;
        auVar13._4_4_ = fVar1;
        auVar13._0_4_ = fVar1;
        auVar13._8_4_ = fVar1;
        auVar13._12_4_ = fVar1;
        auVar13 = vfmadd213ps_avx512vl(auVar20,auVar2,auVar13);
        auVar13 = vmaxps_avx(auVar13,ZEXT816(0) << 0x40);
        auVar13 = vminps_avx(auVar13,auVar19);
        auVar21._0_4_ = auVar13._0_4_ * auVar2._0_4_;
        auVar21._4_4_ = auVar13._4_4_ * auVar2._4_4_;
        auVar21._8_4_ = auVar13._8_4_ * auVar2._8_4_;
        auVar21._12_4_ = auVar13._12_4_ * auVar2._12_4_;
        *(undefined1 (*) [16])*pauVar8 = auVar21;
        pauVar8 = (undefined1 (*) [64])(*pauVar8 + 0x10);
        uVar12 = uVar10 + 7;
        uVar10 = uVar10 + 4;
      }
      if (uVar6 - uVar10 != 0 && (int)uVar10 <= (int)uVar6) {
        lVar11 = 0;
        do {
          fVar1 = *(float *)(*pauVar8 + lVar11 * 4);
          fVar23 = 0.0;
          if (fVar1 < (this->super_HardSwish).lower) {
LAB_00471740:
            *(float *)(*pauVar8 + lVar11 * 4) = fVar23;
          }
          else if (fVar1 <= (this->super_HardSwish).upper) {
            auVar2 = vfmadd213ss_fma(ZEXT416((uint)(this->super_HardSwish).alpha),
                                     ZEXT416((uint)fVar1),
                                     ZEXT416((uint)(this->super_HardSwish).beta));
            fVar23 = auVar2._0_4_ * fVar1;
            goto LAB_00471740;
          }
          lVar11 = lVar11 + 1;
        } while (uVar6 - uVar10 != (int)lVar11);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar4);
  }
  return 0;
}

Assistant:

int HardSwish_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _ans = _mm512_mul_ps(_ans, _p);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _ans = _mm_mul_ps(_ans, _p);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ptr++;
        }
    }

    return 0;
}